

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
::iterator::operator*(iterator *this)

{
  char cVar1;
  ctrl_t *pcVar2;
  char *pcVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  size_type sVar15;
  uint uVar16;
  ulong uVar17;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
    ::iterator::operator*((iterator *)this);
LAB_00d56507:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar2 == kEmptyGroup + 0x10) goto LAB_00d56507;
    if (kSentinel < *pcVar2) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
  ::iterator::operator*((iterator *)this);
  pcVar3 = (((reference)this)->first)._M_dataplus._M_p;
  if (pcVar3 == (char *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
    ::iterator::operator++((iterator *)this);
LAB_00d5658d:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
    ::iterator::operator++((iterator *)this);
  }
  else {
    if (pcVar3 == kEmptyGroup + 0x10) goto LAB_00d5658d;
    if (-1 < *pcVar3) {
      (((reference)this)->first)._M_dataplus._M_p = pcVar3 + 1;
      sVar15 = (((reference)this)->first)._M_string_length + 0x28;
      (((reference)this)->first)._M_string_length = sVar15;
      cVar1 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
      while (cVar1 < -1) {
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar3 < (char)iVar7);
        in_XMM1_Bb = -(pcVar3[1] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bc = -(pcVar3[2] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bd = -(pcVar3[3] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Be = -(pcVar3[4] < (char)iVar8);
        in_XMM1_Bf = -(pcVar3[5] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bg = -(pcVar3[6] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bh = -(pcVar3[7] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bi = -(pcVar3[8] < (char)iVar9);
        in_XMM1_Bj = -(pcVar3[9] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bk = -(pcVar3[10] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bl = -(pcVar3[0xb] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bm = -(pcVar3[0xc] < (char)iVar10);
        in_XMM1_Bn = -(pcVar3[0xd] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bo = -(pcVar3[0xe] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bp = -(pcVar3[0xf] < (char)((uint)iVar10 >> 0x18));
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bd;
        auVar14[0] = in_XMM1_Bc;
        auVar14[2] = in_XMM1_Be;
        auVar14[3] = in_XMM1_Bf;
        auVar14[4] = in_XMM1_Bg;
        auVar14[5] = in_XMM1_Bh;
        auVar14[6] = in_XMM1_Bi;
        auVar14[7] = in_XMM1_Bj;
        auVar14[8] = in_XMM1_Bk;
        auVar14[9] = in_XMM1_Bl;
        auVar14[10] = in_XMM1_Bm;
        auVar14[0xb] = in_XMM1_Bn;
        auVar14[0xc] = in_XMM1_Bo;
        auVar14[0xd] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Be;
        auVar13[0] = in_XMM1_Bd;
        auVar13[2] = in_XMM1_Bf;
        auVar13[3] = in_XMM1_Bg;
        auVar13[4] = in_XMM1_Bh;
        auVar13[5] = in_XMM1_Bi;
        auVar13[6] = in_XMM1_Bj;
        auVar13[7] = in_XMM1_Bk;
        auVar13[8] = in_XMM1_Bl;
        auVar13[9] = in_XMM1_Bm;
        auVar13[10] = in_XMM1_Bn;
        auVar13[0xb] = in_XMM1_Bo;
        auVar13[0xc] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bf;
        auVar12[0] = in_XMM1_Be;
        auVar12[2] = in_XMM1_Bg;
        auVar12[3] = in_XMM1_Bh;
        auVar12[4] = in_XMM1_Bi;
        auVar12[5] = in_XMM1_Bj;
        auVar12[6] = in_XMM1_Bk;
        auVar12[7] = in_XMM1_Bl;
        auVar12[8] = in_XMM1_Bm;
        auVar12[9] = in_XMM1_Bn;
        auVar12[10] = in_XMM1_Bo;
        auVar12[0xb] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Bg;
        auVar11[0] = in_XMM1_Bf;
        auVar11[2] = in_XMM1_Bh;
        auVar11[3] = in_XMM1_Bi;
        auVar11[4] = in_XMM1_Bj;
        auVar11[5] = in_XMM1_Bk;
        auVar11[6] = in_XMM1_Bl;
        auVar11[7] = in_XMM1_Bm;
        auVar11[8] = in_XMM1_Bn;
        auVar11[9] = in_XMM1_Bo;
        auVar11[10] = in_XMM1_Bp;
        uVar16 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar4 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar17 = (ulong)uVar4;
        (((reference)this)->first)._M_dataplus._M_p = pcVar3 + uVar17;
        sVar15 = sVar15 + uVar17 * 0x28;
        (((reference)this)->first)._M_string_length = sVar15;
        cVar1 = pcVar3[uVar17];
        pcVar3 = pcVar3 + uVar17;
      }
      if (cVar1 != -1) {
        return (reference)this;
      }
      goto LAB_00d56597;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
  ::iterator::operator++((iterator *)this);
LAB_00d56597:
  (((reference)this)->first)._M_dataplus._M_p = (pointer)0x0;
  return (reference)this;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }